

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::SourceCodeInfo_Location::InternalSwap
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *other)

{
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  Rep *pRVar4;
  string *psVar5;
  UnknownFieldSet *other_00;
  
  pvVar3 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar3 & 1) == 0) goto LAB_002eb6e9;
LAB_002eb6dc:
    other_00 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar3 & 1) != 0) goto LAB_002eb6dc;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002eb6e9:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pvVar3 = (this->path_).arena_or_elements_;
  (this->path_).arena_or_elements_ = (other->path_).arena_or_elements_;
  (other->path_).arena_or_elements_ = pvVar3;
  iVar2 = (this->path_).current_size_;
  (this->path_).current_size_ = (other->path_).current_size_;
  (other->path_).current_size_ = iVar2;
  iVar2 = (this->path_).total_size_;
  (this->path_).total_size_ = (other->path_).total_size_;
  (other->path_).total_size_ = iVar2;
  pvVar3 = (this->span_).arena_or_elements_;
  (this->span_).arena_or_elements_ = (other->span_).arena_or_elements_;
  (other->span_).arena_or_elements_ = pvVar3;
  iVar2 = (this->span_).current_size_;
  (this->span_).current_size_ = (other->span_).current_size_;
  (other->span_).current_size_ = iVar2;
  iVar2 = (this->span_).total_size_;
  (this->span_).total_size_ = (other->span_).total_size_;
  (other->span_).total_size_ = iVar2;
  pRVar4 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_ =
       (other->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
  (other->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ =
       (other->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  (other->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_;
  (this->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_ =
       (other->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_;
  (other->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  psVar5 = (this->leading_comments_).ptr_;
  (this->leading_comments_).ptr_ = (other->leading_comments_).ptr_;
  (other->leading_comments_).ptr_ = psVar5;
  psVar5 = (this->trailing_comments_).ptr_;
  (this->trailing_comments_).ptr_ = (other->trailing_comments_).ptr_;
  (other->trailing_comments_).ptr_ = psVar5;
  return;
}

Assistant:

void SourceCodeInfo_Location::InternalSwap(SourceCodeInfo_Location* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  path_.InternalSwap(&other->path_);
  span_.InternalSwap(&other->span_);
  leading_detached_comments_.InternalSwap(&other->leading_detached_comments_);
  leading_comments_.Swap(&other->leading_comments_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  trailing_comments_.Swap(&other->trailing_comments_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
}